

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

TValueCC calcCC<stSampleMulti<short,4>>
                   (TWaveformViewT<TSampleMI16> *waveform0,TWaveformViewT<TSampleMI16> *waveform1,
                   int64_t sum0,int64_t sum02)

{
  short sVar1;
  long lVar2;
  stSampleMulti<short,_4> *psVar3;
  long lVar4;
  long lVar5;
  stSampleMulti<short,_4> *psVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int j;
  long lVar10;
  double dVar11;
  
  psVar6 = waveform0->samples;
  lVar2 = waveform0->n;
  if (waveform1->n < waveform0->n) {
    lVar2 = waveform1->n;
  }
  lVar8 = 0;
  lVar9 = 0;
  if (0 < lVar2) {
    lVar9 = lVar2;
  }
  psVar3 = waveform1->samples;
  lVar7 = 0;
  lVar4 = 0;
  lVar5 = 0;
  for (; lVar8 != lVar9; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      sVar1 = (psVar3->super_array<short,_4UL>)._M_elems[lVar10];
      lVar5 = lVar5 + sVar1;
      lVar4 = lVar4 + (ulong)(uint)((int)sVar1 * (int)sVar1);
      lVar7 = lVar7 + (long)(psVar6->super_array<short,_4UL>)._M_elems[lVar10] * (long)sVar1;
    }
    psVar6 = psVar6 + 1;
    psVar3 = psVar3 + 1;
  }
  lVar2 = lVar2 * 4;
  dVar11 = (double)(lVar4 * lVar2 - lVar5 * lVar5) * (double)(sum02 * lVar2 - sum0 * sum0);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  return (double)(lVar7 * lVar2 - lVar5 * sum0) / dVar11;
}

Assistant:

TValueCC calcCC(
    const TWaveformViewT<TSampleMI16> & waveform0,
    const TWaveformViewT<TSampleMI16> & waveform1,
    int64_t sum0, int64_t sum02) {
    TValueCC cc = -1.0f;

    int64_t sum1 = 0;
    int64_t sum12 = 0;
    int64_t sum01 = 0;

    auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;
    auto n1       = waveform1.n;

#ifdef MY_DEBUG
    if (n0 != n1) {
        printf("BUG 234f8273\n");
    }
#endif
    auto n = std::min(n0, n1);

    for (int64_t is = 0; is < n; ++is) {
        for (int j = 0; j < TSampleMI16::N; j++) {
            int32_t a0 = samples0[is][j];
            int32_t a1 = samples1[is][j];

            sum1 += a1;
            sum12 += a1*a1;
            sum01 += a0*a1;
        }
    }

    n *= TSampleMI16::N;

    {
        double nom   = sum01*n - sum0*sum1;
        double den2a = sum02*n - sum0*sum0;
        double den2b = sum12*n - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}